

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx *dctx,void *src,size_t srcSize)

{
  byte bVar1;
  byte bVar2;
  U16 UVar3;
  uint uVar4;
  U32 UVar5;
  uint uVar6;
  HUF_DTable *dctx_00;
  size_t code;
  ulong uVar7;
  ulong in_RDX;
  byte *in_RSI;
  long in_RDI;
  bool bVar8;
  size_t lhSize_2;
  size_t litSize_2;
  U32 lhlCode_2;
  U32 lhlCode_1;
  size_t lhSize_1;
  size_t litSize_1;
  U32 lhc;
  U32 lhlCode;
  U32 singleStream;
  size_t litCSize;
  size_t litSize;
  size_t lhSize;
  symbolEncodingType_e litEncType;
  BYTE *istart;
  void *in_stack_ffffffffffffff38;
  int bmi2;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  size_t in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  HUF_DTable *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff80;
  long lVar9;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  size_t local_60;
  ulong local_48;
  ulong local_40;
  long local_38;
  size_t local_8;
  
  if (in_RDX < 3) {
    return 0xffffffffffffffec;
  }
  uVar4 = *in_RSI & 3;
  dctx_00 = (HUF_DTable *)(ulong)uVar4;
  switch(dctx_00) {
  case (HUF_DTable *)0x0:
    switch(*in_RSI >> 2 & 3) {
    case 0:
    case 2:
    default:
      lVar9 = 1;
      local_60 = (size_t)((int)(uint)*in_RSI >> 3);
      break;
    case 1:
      lVar9 = 2;
      UVar3 = MEM_readLE16(in_stack_ffffffffffffff38);
      local_60 = (size_t)((int)(uint)UVar3 >> 4);
      break;
    case 3:
      lVar9 = 3;
      UVar5 = MEM_readLE24((void *)0x1ff5a4);
      local_60 = (size_t)(UVar5 >> 4);
    }
    if (in_RDX < lVar9 + local_60 + 8) {
      if (in_RDX < local_60 + lVar9) {
        local_8 = 0xffffffffffffffec;
      }
      else {
        memcpy((void *)(in_RDI + 0x71cc),in_RSI + lVar9,local_60);
        *(long *)(in_RDI + 0x7118) = in_RDI + 0x71cc;
        *(size_t *)(in_RDI + 0x7138) = local_60;
        memset((void *)(in_RDI + 0x71cc + *(long *)(in_RDI + 0x7138)),0,8);
        local_8 = lVar9 + local_60;
      }
    }
    else {
      *(byte **)(in_RDI + 0x7118) = in_RSI + lVar9;
      *(size_t *)(in_RDI + 0x7138) = local_60;
      local_8 = lVar9 + local_60;
    }
    break;
  case (HUF_DTable *)0x1:
    switch(*in_RSI >> 2 & 3) {
    case 0:
    case 2:
    default:
      lVar9 = 1;
      uVar7 = (ulong)((int)(uint)*in_RSI >> 3);
      break;
    case 1:
      lVar9 = 2;
      UVar3 = MEM_readLE16(in_stack_ffffffffffffff38);
      uVar7 = (ulong)((int)(uint)UVar3 >> 4);
      break;
    case 3:
      lVar9 = 3;
      UVar5 = MEM_readLE24((void *)0x1ff765);
      uVar7 = (ulong)(UVar5 >> 4);
      if (in_RDX < 4) {
        return 0xffffffffffffffec;
      }
    }
    if (uVar7 < 0x20001) {
      memset((void *)(in_RDI + 0x71cc),(uint)in_RSI[lVar9],uVar7 + 8);
      *(long *)(in_RDI + 0x7118) = in_RDI + 0x71cc;
      *(ulong *)(in_RDI + 0x7138) = uVar7;
      local_8 = lVar9 + 1;
    }
    else {
      local_8 = 0xffffffffffffffec;
    }
    break;
  case (HUF_DTable *)0x2:
    goto switchD_001ff0b9_caseD_2;
  case (HUF_DTable *)0x3:
    if (*(int *)(in_RDI + 0x70a8) == 0) {
      return 0xffffffffffffffe2;
    }
switchD_001ff0b9_caseD_2:
    if (in_RDX < 5) {
      return 0xffffffffffffffec;
    }
    bVar8 = false;
    bVar1 = *in_RSI >> 2;
    bVar2 = bVar1 & 3;
    UVar5 = MEM_readLE32(in_stack_ffffffffffffff38);
    if (bVar2 < 2) {
LAB_001ff154:
      bVar8 = (bVar1 & 3) == 0;
      local_38 = 3;
      local_40 = (ulong)(UVar5 >> 4 & 0x3ff);
      local_48 = (ulong)(UVar5 >> 0xe & 0x3ff);
    }
    else if (bVar2 == 2) {
      local_38 = 4;
      local_40 = (ulong)(UVar5 >> 4 & 0x3fff);
      local_48 = (ulong)(UVar5 >> 0x12);
    }
    else {
      if (bVar2 != 3) goto LAB_001ff154;
      local_38 = 5;
      local_40 = (ulong)(UVar5 >> 4 & 0x3ffff);
      local_48 = (ulong)((UVar5 >> 0x16) + (uint)in_RSI[4] * 0x400);
    }
    if (local_40 < 0x20001) {
      if (in_RDX < local_48 + local_38) {
        local_8 = 0xffffffffffffffec;
      }
      else {
        if (uVar4 == 3) {
          bmi2 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
          if (bVar8) {
            code = HUF_decompress1X_usingDTable_bmi2
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                              in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                              (HUF_DTable *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),bmi2);
          }
          else {
            code = HUF_decompress4X_usingDTable_bmi2
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                              in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                              (HUF_DTable *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),bmi2);
          }
        }
        else if (bVar8) {
          code = HUF_decompress1X2_DCtx_wksp_bmi2
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff48,
                            (void *)CONCAT44(in_stack_ffffffffffffff44,
                                             *(undefined4 *)(in_RDI + 0x7150)),
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
        }
        else {
          code = HUF_decompress4X_hufOnly_wksp_bmi2
                           (dctx_00,(void *)((ulong)CONCAT14(bVar1,in_stack_ffffffffffffff70) &
                                            0x3ffffffff),(size_t)in_stack_ffffffffffffff68,
                            in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff50,
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff98);
        }
        uVar6 = ERR_isError(code);
        if (uVar6 == 0) {
          *(long *)(in_RDI + 0x7118) = in_RDI + 0x71cc;
          *(ulong *)(in_RDI + 0x7138) = local_40;
          *(undefined4 *)(in_RDI + 0x70a8) = 1;
          if (uVar4 == 2) {
            *(long *)(in_RDI + 0x18) = in_RDI + 0x2838;
          }
          memset((void *)(in_RDI + 0x71cc + *(long *)(in_RDI + 0x7138)),0,8);
          local_8 = local_48 + local_38;
        }
        else {
          local_8 = 0xffffffffffffffec;
        }
      }
    }
    else {
      local_8 = 0xffffffffffffffec;
    }
    break;
  default:
    local_8 = 0xffffffffffffffec;
  }
  return local_8;
}

Assistant:

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx* dctx,
                          const void* src, size_t srcSize)   /* note : srcSize < BLOCKSIZE */
{
    if (srcSize < MIN_CBLOCK_SIZE) return ERROR(corruption_detected);

    {   const BYTE* const istart = (const BYTE*) src;
        symbolEncodingType_e const litEncType = (symbolEncodingType_e)(istart[0] & 3);

        switch(litEncType)
        {
        case set_repeat:
            if (dctx->litEntropy==0) return ERROR(dictionary_corrupted);
            /* fall-through */
        case set_compressed:
            if (srcSize < 5) return ERROR(corruption_detected);   /* srcSize >= MIN_CBLOCK_SIZE == 3; here we need up to 5 for case 3 */
            {   size_t lhSize, litSize, litCSize;
                U32 singleStream=0;
                U32 const lhlCode = (istart[0] >> 2) & 3;
                U32 const lhc = MEM_readLE32(istart);
                switch(lhlCode)
                {
                case 0: case 1: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    /* 2 - 2 - 10 - 10 */
                    singleStream = !lhlCode;
                    lhSize = 3;
                    litSize  = (lhc >> 4) & 0x3FF;
                    litCSize = (lhc >> 14) & 0x3FF;
                    break;
                case 2:
                    /* 2 - 2 - 14 - 14 */
                    lhSize = 4;
                    litSize  = (lhc >> 4) & 0x3FFF;
                    litCSize = lhc >> 18;
                    break;
                case 3:
                    /* 2 - 2 - 18 - 18 */
                    lhSize = 5;
                    litSize  = (lhc >> 4) & 0x3FFFF;
                    litCSize = (lhc >> 22) + (istart[4] << 10);
                    break;
                }
                if (litSize > ZSTD_BLOCKSIZE_MAX) return ERROR(corruption_detected);
                if (litCSize + lhSize > srcSize) return ERROR(corruption_detected);

                if (HUF_isError((litEncType==set_repeat) ?
                                    ( singleStream ?
                                        HUF_decompress1X_usingDTable_bmi2(dctx->litBuffer, litSize, istart+lhSize, litCSize, dctx->HUFptr, dctx->bmi2) :
                                        HUF_decompress4X_usingDTable_bmi2(dctx->litBuffer, litSize, istart+lhSize, litCSize, dctx->HUFptr, dctx->bmi2) ) :
                                    ( singleStream ?
                                        HUF_decompress1X2_DCtx_wksp_bmi2(dctx->entropy.hufTable, dctx->litBuffer, litSize, istart+lhSize, litCSize,
                                                                         dctx->entropy.workspace, sizeof(dctx->entropy.workspace), dctx->bmi2) :
                                        HUF_decompress4X_hufOnly_wksp_bmi2(dctx->entropy.hufTable, dctx->litBuffer, litSize, istart+lhSize, litCSize,
                                                                           dctx->entropy.workspace, sizeof(dctx->entropy.workspace), dctx->bmi2))))
                    return ERROR(corruption_detected);

                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                dctx->litEntropy = 1;
                if (litEncType==set_compressed) dctx->HUFptr = dctx->entropy.hufTable;
                memset(dctx->litBuffer + dctx->litSize, 0, WILDCOPY_OVERLENGTH);
                return litCSize + lhSize;
            }

        case set_basic:
            {   size_t litSize, lhSize;
                U32 const lhlCode = ((istart[0]) >> 2) & 3;
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }

                if (lhSize+litSize+WILDCOPY_OVERLENGTH > srcSize) {  /* risk reading beyond src buffer with wildcopy */
                    if (litSize+lhSize > srcSize) return ERROR(corruption_detected);
                    memcpy(dctx->litBuffer, istart+lhSize, litSize);
                    dctx->litPtr = dctx->litBuffer;
                    dctx->litSize = litSize;
                    memset(dctx->litBuffer + dctx->litSize, 0, WILDCOPY_OVERLENGTH);
                    return lhSize+litSize;
                }
                /* direct reference into compressed stream */
                dctx->litPtr = istart+lhSize;
                dctx->litSize = litSize;
                return lhSize+litSize;
            }

        case set_rle:
            {   U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t litSize, lhSize;
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    litSize = MEM_readLE24(istart) >> 4;
                    if (srcSize<4) return ERROR(corruption_detected);   /* srcSize >= MIN_CBLOCK_SIZE == 3; here we need lhSize+1 = 4 */
                    break;
                }
                if (litSize > ZSTD_BLOCKSIZE_MAX) return ERROR(corruption_detected);
                memset(dctx->litBuffer, istart[lhSize], litSize + WILDCOPY_OVERLENGTH);
                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                return lhSize+1;
            }
        default:
            return ERROR(corruption_detected);   /* impossible */
        }
    }
}